

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Bool prvTidyAttributeIsProprietary(Node *node,AttVal *attval)

{
  Bool BVar1;
  uint uVar2;
  
  BVar1 = no;
  if (((attval != (AttVal *)0x0 && node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
     ((node->tag->versions & 0x61fff) != 0)) {
    uVar2 = AttributeVersions(node,attval);
    BVar1 = (Bool)((uVar2 & 0x61fff) == 0);
  }
  return BVar1;
}

Assistant:

Bool TY_(AttributeIsProprietary)(Node* node, AttVal* attval)
{
    if (!node || !attval)
        return no;

    if (!node->tag)
        return no;

    if (!(node->tag->versions & VERS_ALL))
        return no;

    if (AttributeVersions(node, attval) & VERS_ALL)
        return no;

    return yes;
}